

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O0

int mtx_unlock(mtx_t *mtx)

{
  int iVar1;
  mtx_t *mtx_local;
  
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)mtx);
  return (uint)(iVar1 == 0);
}

Assistant:

int mtx_unlock(mtx_t *mtx)
{
#if defined(_TTHREAD_WIN32_)
  mtx->mAlreadyLocked = FALSE;
  LeaveCriticalSection(&mtx->mHandle);
  return thrd_success;
#else
  return pthread_mutex_unlock(mtx) == 0 ? thrd_success : thrd_error;;
#endif
}